

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  undefined8 uVar2;
  pointer pCVar3;
  __single_object _Var4;
  bool bVar5;
  TokenType TVar6;
  Result RVar7;
  pointer *__ptr;
  _Head_base<0UL,_wabt::TryTableExpr_*,_false> _Var8;
  undefined1 local_d8 [16];
  CatchVector catches;
  __single_object expr;
  char *pcStack_a8;
  anon_union_16_2_ecfd7102_for_Location_1 local_a0;
  undefined1 local_90 [40];
  Location loc;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  GetLocation(&loc,this);
  TVar6 = Peek(this,0);
  if (TVar6 == TryTable) {
    Consume((Token *)&expr,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr);
    std::make_unique<wabt::TryTableExpr,wabt::Location&>((Location *)&expr);
    RVar7 = ParseLabelOpt(this,(string *)
                               ((long)expr._M_t.
                                      super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                      .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                      _M_head_impl + 0x40));
    _Var8._M_head_impl = (TryTableExpr *)expr;
    if (((RVar7.enum_ == Error) ||
        (RVar7 = ParseBlockDeclaration
                           (this,(BlockDeclaration *)
                                 ((long)expr._M_t.
                                        super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                        .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                        _M_head_impl + 0x60)),
        _Var8._M_head_impl = (TryTableExpr *)expr, RVar7.enum_ == Error)) ||
       (RVar7 = ParseTryTableCatches
                          (this,(TryTableVector *)
                                ((long)expr._M_t.
                                       super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                       .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                       _M_head_impl + 0x118)),
       _Var8._M_head_impl = (TryTableExpr *)expr, RVar7.enum_ == Error)) goto LAB_0015969d;
    RVar7 = ParseInstrList(this,(ExprList *)
                                ((long)expr._M_t.
                                       super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                       .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                       _M_head_impl + 0xe0));
  }
  else {
    if (TVar6 == If) {
      Consume((Token *)&expr,this);
      std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)&catches);
      RVar7 = ParseLabelOpt(this,(string *)
                                 &((catches.
                                    super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->var).type_);
      _Var8._M_head_impl =
           (TryTableExpr *)
           catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((RVar7.enum_ == Error) ||
         (RVar7 = ParseBlock(this,(Block *)&((catches.
                                              super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->var).type_
                            ),
         _Var8._M_head_impl =
              (TryTableExpr *)
              catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
              super__Vector_impl_data._M_start, RVar7.enum_ == Error)) goto LAB_0015969d;
      bVar5 = Match(this,Else);
      if (bVar5) {
        RVar7 = ParseEndLabelOpt(this,(string *)
                                      &((catches.
                                         super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->var).type_);
        _Var8._M_head_impl =
             (TryTableExpr *)
             catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((RVar7.enum_ == Error) ||
           (RVar7 = ParseTerminatingInstrList
                              (this,(ExprList *)
                                    ((long)&catches.
                                            super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].loc.field_1
                                    + 8)),
           _Var8._M_head_impl =
                (TryTableExpr *)
                catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                super__Vector_impl_data._M_start, RVar7.enum_ == Error)) goto LAB_0015969d;
        GetLocation((Location *)&expr,this);
        *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
         &catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
          super__Vector_impl_data._M_start[2].var.type_ = local_a0.field_1.offset;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start[2].var.field_2.name_._M_dataplus._M_p =
             (pointer)local_a0._8_8_;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start[2].var.loc.field_1.field_1.offset =
             (size_t)expr._M_t.
                     super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                     .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl;
        *(char **)((long)&catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                          _M_impl.super__Vector_impl_data._M_start[2].var.loc.field_1 + 8) =
             pcStack_a8;
      }
      RVar7 = Expect(this,End);
      _Var8._M_head_impl =
           (TryTableExpr *)
           catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((RVar7.enum_ == Error) ||
         (RVar7 = ParseEndLabelOpt(this,(string *)
                                        &((catches.
                                           super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->var).type_),
         pCVar3 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                  super__Vector_impl_data._M_start,
         _Var8._M_head_impl =
              (TryTableExpr *)
              catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
              super__Vector_impl_data._M_start, RVar7.enum_ == Error)) goto LAB_0015969d;
      catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pCVar3;
      if (pEVar1 == (Expr *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expr[1])();
      _Var8._M_head_impl =
           (TryTableExpr *)
           catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
           super__Vector_impl_data._M_start;
      goto LAB_001596e3;
    }
    if (TVar6 == Loop) {
      Consume((Token *)&expr,this);
      std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>((Location *)&expr);
    }
    else {
      if (TVar6 == Try) {
        Consume((Token *)&expr,this);
        ErrorUnlessOpcodeEnabled(this,(Token *)&expr);
        std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)local_d8);
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        RVar7 = ParseLabelOpt(this,(string *)(local_d8._0_8_ + 0x40));
        if ((RVar7.enum_ != Error) &&
           (RVar7 = ParseBlock(this,(Block *)(local_d8._0_8_ + 0x40)), RVar7.enum_ != Error)) {
          TVar6 = Peek(this,0);
          if ((TVar6 & ~After) == Catch) {
            RVar7 = ParseCatchInstrList(this,(CatchVector *)(local_d8._0_8_ + 0x118));
            if (RVar7.enum_ == Error) goto LAB_0015968f;
            *(undefined4 *)
             &(((ExprMixin<(wabt::ExprType)62> *)local_d8._0_8_)->super_Expr).field_0x3c = 1;
          }
          else {
            TVar6 = Peek(this,0);
            if (TVar6 == Delegate) {
              Consume((Token *)&expr,this);
              Var::Var((Var *)&expr);
              RVar7 = ParseVar(this,(Var *)&expr);
              if (RVar7.enum_ == Error) {
                Var::~Var((Var *)&expr);
                goto LAB_0015968f;
              }
              Var::operator=((Var *)(local_d8._0_8_ + 0x130),(Var *)&expr);
              *(undefined4 *)
               &(((ExprMixin<(wabt::ExprType)62> *)local_d8._0_8_)->super_Expr).field_0x3c = 2;
              Var::~Var((Var *)&expr);
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&expr,"a valid try clause",(allocator<char> *)(local_d8 + 0xf));
          local_48 = 0;
          uStack_40 = 0;
          local_38 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                     (string *)&expr,local_90);
          RVar7 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_48,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48);
          std::__cxx11::string::_M_dispose();
          if (RVar7.enum_ != Error) {
            GetLocation((Location *)&expr,this);
            (((Block *)(local_d8._0_8_ + 0x40))->end_loc).field_1.field_1.offset =
                 (size_t)local_a0.field_1.offset;
            *(undefined8 *)((long)&(((Block *)(local_d8._0_8_ + 0x40))->end_loc).field_1 + 8) =
                 local_a0._8_8_;
            *(__uniq_ptr_data<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>,_true,_true>
              *)&(((Block *)(local_d8._0_8_ + 0x40))->end_loc).filename =
                 expr._M_t.
                 super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                 .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl;
            (((Block *)(local_d8._0_8_ + 0x40))->end_loc).filename._M_str = pcStack_a8;
            if (((*(int *)&(((ExprMixin<(wabt::ExprType)62> *)local_d8._0_8_)->super_Expr).
                           field_0x3c == 2) || (RVar7 = Expect(this,End), RVar7.enum_ != Error)) &&
               (RVar7 = ParseEndLabelOpt(this,(string *)(local_d8._0_8_ + 0x40)),
               uVar2 = local_d8._0_8_, RVar7.enum_ != Error)) {
              local_d8._0_8_ = (TryTableExpr *)0x0;
              pEVar1 = (out_expr->_M_t).
                       super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
              (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar2;
              if (pEVar1 != (Expr *)0x0) {
                (*pEVar1->_vptr_Expr[1])();
              }
              std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&catches);
              _Var8._M_head_impl = (TryTableExpr *)local_d8._0_8_;
              goto LAB_001596e3;
            }
          }
        }
LAB_0015968f:
        std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&catches);
        _Var8._M_head_impl = (TryTableExpr *)local_d8._0_8_;
        goto LAB_0015969d;
      }
      if (TVar6 != Block) {
        __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0xc36,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
      }
      Consume((Token *)&expr,this);
      std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((Location *)&expr);
    }
    RVar7 = ParseLabelOpt(this,(string *)
                               ((long)expr._M_t.
                                      super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                      .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                      _M_head_impl + 0x40));
    _Var8._M_head_impl = (TryTableExpr *)expr;
    if (RVar7.enum_ == Error) goto LAB_0015969d;
    RVar7 = ParseBlock(this,(Block *)((long)expr._M_t.
                                            super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                            .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                            _M_head_impl + 0x40));
  }
  _Var8._M_head_impl =
       (TryTableExpr *)
       expr._M_t.super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
       ._M_t.super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>.
       super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl;
  if (((RVar7.enum_ != Error) &&
      (RVar7 = Expect(this,End), _Var8._M_head_impl = (TryTableExpr *)expr, RVar7.enum_ != Error))
     && (RVar7 = ParseEndLabelOpt(this,(string *)
                                       ((long)expr._M_t.
                                              super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                                              .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>.
                                              _M_head_impl + 0x40)), _Var4 = expr,
        _Var8._M_head_impl = (TryTableExpr *)expr, RVar7.enum_ != Error)) {
    expr._M_t.super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>.
    super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>,_true,_true>)
         (__uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>)0x0;
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (Expr *)_Var4._M_t.
                 super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                 .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl;
    if (pEVar1 == (Expr *)0x0) {
      return (Result)Ok;
    }
    (*pEVar1->_vptr_Expr[1])();
    _Var8._M_head_impl = (TryTableExpr *)expr;
LAB_001596e3:
    if ((tuple<wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>)_Var8._M_head_impl !=
        (_Head_base<0UL,_wabt::TryTableExpr_*,_false>)0x0) {
      (*((_Var8._M_head_impl)->super_ExprMixin<(wabt::ExprType)62>).super_Expr._vptr_Expr[1])();
    }
    return (Result)Ok;
  }
LAB_0015969d:
  if ((tuple<wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>)_Var8._M_head_impl !=
      (_Head_base<0UL,_wabt::TryTableExpr_*,_false>)0x0) {
    (*((_func_int **)
      (((Location *)&(_Var8._M_head_impl)->super_ExprMixin<(wabt::ExprType)62>)->filename)._M_len)
      [1])();
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = std::make_unique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = std::make_unique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = std::make_unique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryExpr>(loc);
      CatchVector catches;
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      if (IsCatch(Peek())) {
        CHECK_RESULT(ParseCatchInstrList(&expr->catches));
        expr->kind = TryKind::Catch;
      } else if (PeekMatch(TokenType::Delegate)) {
        Consume();
        Var var;
        CHECK_RESULT(ParseVar(&var));
        expr->delegate_target = var;
        expr->kind = TryKind::Delegate;
      }
      CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
      expr->block.end_loc = GetLocation();
      if (expr->kind != TryKind::Delegate) {
        EXPECT(End);
      }
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::TryTable: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryTableExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
      CHECK_RESULT(ParseTryTableCatches(&expr->catches));
      CHECK_RESULT(ParseInstrList(&expr->block.exprs));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}